

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O2

Qiniu_Error Qiniu_Qetag_mergeBlocks(_Qiniu_Qetag_Context *ctx)

{
  undefined1 *puVar1;
  undefined2 uVar2;
  ushort uVar3;
  Qiniu_Crypto_Result QVar4;
  ushort uVar5;
  char *pcVar6;
  undefined8 uVar7;
  Qiniu_Error QVar8;
  uchar digest [20];
  
  uVar3 = ctx->blkElementCount;
  uVar5 = ctx->blkUnused;
  while ((uVar7 = 200, uVar5 < uVar3 &&
         (uVar3 = ctx->blkBegin, (ctx->blkArray[uVar3].field_0.field_0x2 & 0x80) != 0))) {
    QVar4 = Qiniu_Digest_Final(ctx->blkArray[uVar3].sha1Digest,digest,(size_t *)0x0);
    uVar7 = 9999;
    if (QVar4 != QINIU_CRYPTO_RESULT_OK) {
LAB_00113654:
      pcVar6 = "openssl internal error";
      goto LAB_0011365b;
    }
    QVar4 = Qiniu_Digest_Update(ctx->sha1Digest,digest,0x14);
    if (QVar4 != QINIU_CRYPTO_RESULT_OK) goto LAB_00113654;
    puVar1 = &ctx->blkArray[uVar3].field_0.field_0x2;
    *puVar1 = *puVar1 & 0x7f;
    uVar2 = ctx->blkBegin;
    uVar5 = uVar2 + 1;
    uVar3 = ctx->blkElementCount;
    if (uVar3 <= uVar5) {
      uVar5 = 0;
    }
    ctx->blkBegin = uVar5;
    uVar5 = ctx->blkUnused + 1;
    ctx->blkUnused = uVar5;
  }
  pcVar6 = "ok";
LAB_0011365b:
  QVar8.message = pcVar6;
  QVar8._0_8_ = uVar7;
  return QVar8;
}

Assistant:

static Qiniu_Error Qiniu_Qetag_mergeBlocks(struct _Qiniu_Qetag_Context * ctx) {
    Qiniu_Error err;
    unsigned char digest[SHA_DIGEST_LENGTH];
    struct _Qiniu_Qetag_Block * blk = NULL;

    while (ctx->blkUnused < ctx->blkElementCount && ctx->blkArray[ctx->blkBegin].done == YES) {
        blk = &ctx->blkArray[ctx->blkBegin];

		if (Qiniu_Digest_Final(blk->sha1Digest, digest, NULL) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

		if (Qiniu_Digest_Update(ctx->sha1Digest, digest, sizeof(digest)) != QINIU_CRYPTO_RESULT_OK) {
			err.code = 9999;
			err.message = "openssl internal error";
			return err;
		}

        blk->done = NO;

        ctx->blkBegin += 1;
        if (ctx->blkBegin >= ctx->blkElementCount) {
            ctx->blkBegin = 0;
        }
        ctx->blkUnused += 1;
    } // while

    err.code = 200;
    err.message = "ok";
    return err;
}